

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O3

int CfdGetDefaultBlindingKey
              (void *handle,char *master_blinding_key,char *locking_script,char **blinding_key)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  Privkey privkey;
  allocator local_ea;
  allocator local_e9;
  Script local_e8;
  string local_b0;
  string local_90;
  Privkey local_70;
  Privkey local_50;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(master_blinding_key);
  if (bVar1) {
    local_e8._vptr_Script = (_func_int **)0x5e1cf2;
    local_e8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x448;
    local_e8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdGetDefaultBlindingKey";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_e8,kCfdLogLevelWarning,
               "master blinding key is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e8._vptr_Script =
         (_func_int **)
         ((long)&local_e8.script_data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"Failed to parameter. master blinding key is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_e8);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(locking_script);
  if (!bVar1) {
    if (blinding_key != (char **)0x0) {
      std::__cxx11::string::string((string *)&local_90,master_blinding_key,&local_e9);
      cfd::core::Privkey::Privkey(&local_70,&local_90,kMainnet,true);
      std::__cxx11::string::string((string *)&local_b0,locking_script,&local_ea);
      cfd::core::Script::Script(&local_e8,&local_b0);
      cfd::core::ElementsConfidentialAddress::GetBlindingKey(&local_50,&local_70,&local_e8);
      cfd::core::Script::~Script(&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (local_70.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      cfd::core::Privkey::GetHex_abi_cxx11_((string *)&local_e8,&local_50);
      pcVar2 = cfd::capi::CreateString((string *)&local_e8);
      *blinding_key = pcVar2;
      if (local_e8._vptr_Script !=
          (_func_int **)
          ((long)&local_e8.script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + 8U)) {
        operator_delete(local_e8._vptr_Script);
      }
      if (local_50.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return 0;
    }
    local_e8._vptr_Script = (_func_int **)0x5e1cf2;
    local_e8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x454;
    local_e8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdGetDefaultBlindingKey";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_e8,kCfdLogLevelWarning,"blinding key is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e8._vptr_Script =
         (_func_int **)
         ((long)&local_e8.script_data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"Failed to parameter. blinding key is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_e8);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_e8._vptr_Script = (_func_int **)0x5e1cf2;
  local_e8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x44e;
  local_e8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "CfdGetDefaultBlindingKey";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_e8,kCfdLogLevelWarning,"locking script is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_e8._vptr_Script =
       (_func_int **)
       ((long)&local_e8.script_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"Failed to parameter. locking script is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_e8);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetDefaultBlindingKey(
    void* handle, const char* master_blinding_key, const char* locking_script,
    char** blinding_key) {
  try {
    cfd::Initialize();
    if (IsEmptyString(master_blinding_key)) {
      warn(CFD_LOG_SOURCE, "master blinding key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. master blinding key is null or empty.");
    }
    if (IsEmptyString(locking_script)) {
      warn(CFD_LOG_SOURCE, "locking script is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. locking script is null or empty.");
    }
    if (blinding_key == nullptr) {
      warn(CFD_LOG_SOURCE, "blinding key is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. blinding key is null.");
    }

    Privkey privkey = ElementsConfidentialAddress::GetBlindingKey(
        Privkey(std::string(master_blinding_key)),
        Script(std::string(locking_script)));
    *blinding_key = CreateString(privkey.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}